

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

wchar_t __thiscall CharConvUCS2::readch(CharConvUCS2 *this,CVmDataSource *src)

{
  int iVar1;
  wchar_t wVar2;
  long *in_RSI;
  long *in_RDI;
  uchar buf [2];
  undefined1 local_12 [18];
  
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_12,2);
  if (iVar1 != 0) {
    err_throw(0);
  }
  wVar2 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_12);
  return wVar2;
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read a two-byte character into our buffer */
        unsigned char buf[2];
        if (src->read(buf, 2))
            err_throw(VMERR_READ_FILE);

        /* return the character */
        return file_to_machine(buf);
    }